

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UText * __thiscall
icu_63::RegexMatcher::replaceAll
          (RegexMatcher *this,UText *replacement,UText *dest,UErrorCode *status)

{
  UBool UVar1;
  undefined1 auStack_108 [8];
  UText empty;
  undefined1 local_70 [8];
  UnicodeString emptyString;
  UErrorCode *status_local;
  UText *dest_local;
  UText *replacement_local;
  RegexMatcher *this_local;
  
  emptyString.fUnion._48_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  this_local = (RegexMatcher *)dest;
  if (UVar1 == '\0') {
    UVar1 = ::U_FAILURE(this->fDeferredStatus);
    if (UVar1 == '\0') {
      status_local = (UErrorCode *)dest;
      if (dest == (UText *)0x0) {
        icu_63::UnicodeString::UnicodeString((UnicodeString *)local_70);
        empty.b = 0;
        empty.c = 0;
        empty.privA = 0;
        empty.privP = (void *)0x0;
        empty.a = 0;
        empty.q = (void *)0x0;
        empty.r = (void *)0x0;
        empty.context = (void *)0x0;
        empty.p = (void *)0x0;
        empty.pFuncs = (UTextFuncs *)0x0;
        empty.pExtra = (void *)0x0;
        empty.chunkOffset = 0;
        empty.chunkLength = 0;
        empty.chunkContents = (UChar *)0x0;
        empty.extraSize = 0;
        empty.nativeIndexingLimit = 0;
        empty.chunkNativeStart = 0;
        empty.providerProperties = 0;
        empty.sizeOfStruct = 0;
        empty.chunkNativeLimit = 0;
        auStack_108._0_4_ = 0x345ad82c;
        auStack_108._4_4_ = 0;
        empty.magic = 0;
        empty.flags = 0x90;
        utext_openUnicodeString_63
                  ((UText *)auStack_108,(UnicodeString *)local_70,
                   (UErrorCode *)emptyString.fUnion._48_8_);
        status_local = (UErrorCode *)
                       utext_clone_63((UText *)0x0,(UText *)auStack_108,'\x01','\0',
                                      (UErrorCode *)emptyString.fUnion._48_8_);
        utext_close_63((UText *)auStack_108);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_70);
      }
      UVar1 = ::U_SUCCESS(*(UErrorCode *)emptyString.fUnion._48_8_);
      if (UVar1 != '\0') {
        reset(this);
        do {
          UVar1 = find(this);
          if (UVar1 == '\0') break;
          appendReplacement(this,(UText *)status_local,replacement,
                            (UErrorCode *)emptyString.fUnion._48_8_);
          UVar1 = ::U_FAILURE(*(UErrorCode *)emptyString.fUnion._48_8_);
        } while (UVar1 == '\0');
        appendTail(this,(UText *)status_local,(UErrorCode *)emptyString.fUnion._48_8_);
      }
      this_local = (RegexMatcher *)status_local;
    }
    else {
      *(UErrorCode *)emptyString.fUnion._48_8_ = this->fDeferredStatus;
    }
  }
  return (UText *)this_local;
}

Assistant:

UText *RegexMatcher::replaceAll(UText *replacement, UText *dest, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return dest;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return dest;
    }

    if (dest == NULL) {
        UnicodeString emptyString;
        UText empty = UTEXT_INITIALIZER;

        utext_openUnicodeString(&empty, &emptyString, &status);
        dest = utext_clone(NULL, &empty, TRUE, FALSE, &status);
        utext_close(&empty);
    }

    if (U_SUCCESS(status)) {
        reset();
        while (find()) {
            appendReplacement(dest, replacement, status);
            if (U_FAILURE(status)) {
                break;
            }
        }
        appendTail(dest, status);
    }

    return dest;
}